

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fuzz_issue_tests.cpp
# Opt level: O0

void __thiscall
fuzzFailures_timeoutSingleProblems_Test::fuzzFailures_timeoutSingleProblems_Test
          (fuzzFailures_timeoutSingleProblems_Test *this)

{
  fuzzFailures_timeoutSingleProblems_Test *this_local;
  
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test =
       (_func_int **)&PTR__fuzzFailures_timeoutSingleProblems_Test_00266880;
  return;
}

Assistant:

TEST(fuzzFailures, timeoutSingleProblems)
{
    auto cdata = loadFailureFile("timeout", 28);
    ASSERT_FALSE(cdata.empty());
    precise_unit val;
    EXPECT_NO_THROW(val = unit_from_string(cdata));
    if (!is_error(val)) {
        auto str = to_string(val);
        auto u2 = unit_from_string(str);
        EXPECT_FALSE(is_error(u2));
    }
}